

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigproc.cc
# Opt level: O0

void sptk::snack::xautoc(int windowsize,float *s,int p,float *r,float *e)

{
  undefined4 *in_RCX;
  int in_EDX;
  float *in_RSI;
  int in_EDI;
  float *in_R8;
  double dVar1;
  float sum0;
  float sum;
  float *t;
  float *q;
  int j;
  int i;
  float local_48;
  float local_44;
  float *local_40;
  float *local_38;
  int local_30;
  int local_2c;
  undefined4 *local_20;
  
  local_48 = 0.0;
  local_38 = in_RSI;
  local_2c = in_EDI;
  while (local_2c != 0) {
    local_48 = *local_38 * *local_38 + local_48;
    local_38 = local_38 + 1;
    local_2c = local_2c + -1;
  }
  *in_RCX = 0x3f800000;
  if ((local_48 != 0.0) || (NAN(local_48))) {
    dVar1 = sqrt((double)(local_48 / (float)in_EDI));
    *in_R8 = (float)dVar1;
    local_20 = in_RCX;
    for (local_2c = 1; local_2c <= in_EDX; local_2c = local_2c + 1) {
      local_44 = 0.0;
      local_40 = in_RSI + local_2c;
      local_38 = in_RSI;
      local_30 = in_EDI - local_2c;
      while (local_30 != 0) {
        local_44 = *local_38 * *local_40 + local_44;
        local_40 = local_40 + 1;
        local_38 = local_38 + 1;
        local_30 = local_30 + -1;
      }
      local_20[1] = local_44 * (1.0 / local_48);
      local_20 = local_20 + 1;
    }
  }
  else {
    *in_R8 = 1.0;
    for (local_2c = 1; local_2c <= in_EDX; local_2c = local_2c + 1) {
      in_RCX[local_2c] = 0;
    }
  }
  return;
}

Assistant:

void xautoc(int windowsize, float *s, int p, float *r, float *e)
#endif
{
  register int i, j;
  register float *q, *t, sum, sum0;

  for( i=windowsize, q=s, sum0=0.0; i--;) {
    sum = *q++;
    sum0 += sum*sum;
  }
  *r = 1.;			/* r[0] will always =1. */
  if(sum0 == 0.0) {		/* No energy: fake low-energy white noise. */
    *e = 1.;			/* Arbitrarily assign 1 to rms. */
    /* Now fake autocorrelation of white noise. */
    for ( i=1; i<=p; i++){
      r[i] = 0.;
    }
    return;
  }
  *e = (float) sqrt((double)(sum0/windowsize));
  sum0 = (float) (1.0/sum0);
  for( i=1; i <= p; i++){
    for( sum=0.0, j=windowsize-i, q=s, t=s+i; j--; )
      sum += (*q++) * (*t++);
    *(++r) = sum*sum0;
  }
}